

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf.cc
# Opt level: O0

int PKCS5_PBKDF2_HMAC(char *pass,int passlen,uchar *salt,int saltlen,int iter,EVP_MD *digest,
                     int keylen,uchar *out)

{
  int iVar1;
  HMAC_CTX *pHVar2;
  ulong len;
  undefined4 in_register_0000000c;
  undefined4 in_stack_0000000c;
  ulong local_118;
  size_t k;
  byte local_108 [4];
  uint32_t j;
  uint8_t digest_tmp [64];
  ulong uStack_c0;
  uint8_t i_buf [4];
  size_t todo;
  size_t md_len;
  uint32_t i;
  ScopedHMAC_CTX hctx;
  EVP_MD *digest_local;
  uint32_t iterations_local;
  size_t salt_len_local;
  uint8_t *salt_local;
  size_t password_len_local;
  char *password_local;
  undefined4 extraout_var;
  
  hctx.ctx_.o_ctx.pctx_ops = (evp_md_pctx_ops *)digest;
  bssl::internal::StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>::
  StackAllocated((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup> *)&i);
  pHVar2 = (HMAC_CTX *)
           bssl::internal::StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>::get
                     ((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup> *)&i);
  iVar1 = HMAC_Init_ex(pHVar2,pass,passlen,(EVP_MD *)hctx.ctx_.o_ctx.pctx_ops,(ENGINE *)0x0);
  if (iVar1 == 0) {
    password_local._4_4_ = 0;
  }
  else {
    md_len._0_4_ = 1;
    iVar1 = EVP_MD_size((EVP_MD *)hctx.ctx_.o_ctx.pctx_ops);
    len = CONCAT44(extraout_var,iVar1);
    for (; _keylen != 0; _keylen = _keylen - uStack_c0) {
      uStack_c0 = len;
      if (_keylen < len) {
        uStack_c0 = _keylen;
      }
      digest_tmp[0x3c] = (uint8_t)((uint)(int)md_len >> 0x18);
      digest_tmp[0x3d] = (uint8_t)((uint)(int)md_len >> 0x10);
      digest_tmp[0x3e] = (uint8_t)((uint)(int)md_len >> 8);
      digest_tmp[0x3f] = (uint8_t)(int)md_len;
      pHVar2 = (HMAC_CTX *)
               bssl::internal::StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
               ::get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup> *)&i);
      iVar1 = HMAC_Init_ex(pHVar2,(void *)0x0,0,(EVP_MD *)0x0,(ENGINE *)0x0);
      if (iVar1 == 0) {
LAB_002ef0f0:
        password_local._4_4_ = 0;
        goto LAB_002ef285;
      }
      pHVar2 = (HMAC_CTX *)
               bssl::internal::StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
               ::get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup> *)&i);
      iVar1 = HMAC_Update(pHVar2,salt,CONCAT44(in_register_0000000c,saltlen));
      if (iVar1 == 0) goto LAB_002ef0f0;
      pHVar2 = (HMAC_CTX *)
               bssl::internal::StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
               ::get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup> *)&i);
      iVar1 = HMAC_Update(pHVar2,digest_tmp + 0x3c,4);
      if (iVar1 == 0) goto LAB_002ef0f0;
      pHVar2 = (HMAC_CTX *)
               bssl::internal::StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
               ::get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup> *)&i);
      iVar1 = HMAC_Final(pHVar2,local_108,(uint *)0x0);
      if (iVar1 == 0) goto LAB_002ef0f0;
      OPENSSL_memcpy(out,local_108,uStack_c0);
      for (k._4_4_ = 1; k._4_4_ < (uint)iter; k._4_4_ = k._4_4_ + 1) {
        pHVar2 = (HMAC_CTX *)
                 bssl::internal::
                 StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>::get
                           ((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup> *)
                            &i);
        iVar1 = HMAC_Init_ex(pHVar2,(void *)0x0,0,(EVP_MD *)0x0,(ENGINE *)0x0);
        if (iVar1 == 0) {
LAB_002ef1a8:
          password_local._4_4_ = 0;
          goto LAB_002ef285;
        }
        pHVar2 = (HMAC_CTX *)
                 bssl::internal::
                 StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>::get
                           ((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup> *)
                            &i);
        iVar1 = HMAC_Update(pHVar2,local_108,len);
        if (iVar1 == 0) goto LAB_002ef1a8;
        pHVar2 = (HMAC_CTX *)
                 bssl::internal::
                 StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>::get
                           ((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup> *)
                            &i);
        iVar1 = HMAC_Final(pHVar2,local_108,(uint *)0x0);
        if (iVar1 == 0) goto LAB_002ef1a8;
        for (local_118 = 0; local_118 < uStack_c0; local_118 = local_118 + 1) {
          out[local_118] = out[local_118] ^ local_108[local_118];
        }
      }
      out = out + uStack_c0;
      md_len._0_4_ = (int)md_len + 1;
    }
    if (iter == 0) {
      password_local._4_4_ = 0;
    }
    else {
      password_local._4_4_ = 1;
    }
  }
LAB_002ef285:
  bssl::internal::StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>::
  ~StackAllocated((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup> *)&i);
  return password_local._4_4_;
}

Assistant:

int PKCS5_PBKDF2_HMAC(const char *password, size_t password_len,
                      const uint8_t *salt, size_t salt_len, uint32_t iterations,
                      const EVP_MD *digest, size_t key_len, uint8_t *out_key) {
  // See RFC 8018, section 5.2.
  bssl::ScopedHMAC_CTX hctx;
  if (!HMAC_Init_ex(hctx.get(), password, password_len, digest, NULL)) {
    return 0;
  }

  uint32_t i = 1;
  size_t md_len = EVP_MD_size(digest);
  while (key_len > 0) {
    size_t todo = md_len;
    if (todo > key_len) {
      todo = key_len;
    }

    uint8_t i_buf[4];
    i_buf[0] = (uint8_t)((i >> 24) & 0xff);
    i_buf[1] = (uint8_t)((i >> 16) & 0xff);
    i_buf[2] = (uint8_t)((i >> 8) & 0xff);
    i_buf[3] = (uint8_t)(i & 0xff);

    // Compute U_1.
    uint8_t digest_tmp[EVP_MAX_MD_SIZE];
    if (!HMAC_Init_ex(hctx.get(), NULL, 0, NULL, NULL) ||
        !HMAC_Update(hctx.get(), salt, salt_len) ||
        !HMAC_Update(hctx.get(), i_buf, 4) ||
        !HMAC_Final(hctx.get(), digest_tmp, NULL)) {
      return 0;
    }

    OPENSSL_memcpy(out_key, digest_tmp, todo);
    for (uint32_t j = 1; j < iterations; j++) {
      // Compute the remaining U_* values and XOR.
      if (!HMAC_Init_ex(hctx.get(), NULL, 0, NULL, NULL) ||
          !HMAC_Update(hctx.get(), digest_tmp, md_len) ||
          !HMAC_Final(hctx.get(), digest_tmp, NULL)) {
        return 0;
      }
      for (size_t k = 0; k < todo; k++) {
        out_key[k] ^= digest_tmp[k];
      }
    }

    key_len -= todo;
    out_key += todo;
    i++;
  }

  // RFC 8018 describes iterations (c) as being a "positive integer", so a
  // value of 0 is an error.
  //
  // Unfortunately not all consumers of PKCS5_PBKDF2_HMAC() check their return
  // value, expecting it to succeed and unconditionally using |out_key|.  As a
  // precaution for such callsites in external code, the old behavior of
  // iterations < 1 being treated as iterations == 1 is preserved, but
  // additionally an error result is returned.
  //
  // TODO(eroman): Figure out how to remove this compatibility hack, or change
  // the default to something more sensible like 2048.
  if (iterations == 0) {
    return 0;
  }

  return 1;
}